

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool mkvmuxer::ChunkedCopy(IMkvReader *source,IMkvWriter *dst,int64_t start,int64_t size)

{
  int iVar1;
  void *pvVar2;
  ulong uVar3;
  
  pvVar2 = operator_new__(0x800);
  for (; 0 < size; size = size - uVar3) {
    uVar3 = 0x800;
    if ((ulong)size < 0x800) {
      uVar3 = size;
    }
    iVar1 = (**source->_vptr_IMkvReader)(source,start,uVar3,pvVar2);
    if (iVar1 != 0) goto LAB_007546ee;
    (**dst->_vptr_IMkvWriter)(dst,pvVar2,uVar3 & 0xffffffff);
    start = start + uVar3;
  }
  operator_delete__(pvVar2);
LAB_007546ee:
  return size < 1;
}

Assistant:

bool ChunkedCopy(mkvparser::IMkvReader* source, mkvmuxer::IMkvWriter* dst,
                 int64_t start, int64_t size) {
  // TODO(vigneshv): Check if this is a reasonable value.
  const uint32_t kBufSize = 2048;
  uint8_t* buf = new uint8_t[kBufSize];
  int64_t offset = start;
  while (size > 0) {
    const int64_t read_len = (size > kBufSize) ? kBufSize : size;
    if (source->Read(offset, static_cast<long>(read_len), buf))
      return false;
    dst->Write(buf, static_cast<uint32_t>(read_len));
    offset += read_len;
    size -= read_len;
  }
  delete[] buf;
  return true;
}